

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::OneofDescriptor::GetLocationPath
          (OneofDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int *piVar1;
  iterator iVar2;
  int local_18 [2];
  
  Descriptor::GetLocationPath(*(Descriptor **)(this + 0x10),output);
  local_18[1] = 8;
  iVar2._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,local_18 + 1);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar2._M_current = 8;
    iVar2._M_current = iVar2._M_current + 1;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  local_18[0] = (int)((ulong)((long)this - *(long *)(*(long *)(this + 0x10) + 0x30)) >> 3) *
                -0x33333333;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,local_18);
  }
  else {
    *iVar2._M_current = local_18[0];
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void OneofDescriptor::GetLocationPath(std::vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kOneofDeclFieldNumber);
  output->push_back(index());
}